

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O2

ON_ComponentManifestItem * __thiscall
ON_ComponentManifest::DeleteComponent(ON_ComponentManifest *this,ON_UUID manifest_item_id)

{
  ON_ComponentManifestImpl *this_00;
  ON_ComponentManifestItem_PRIVATE *pOVar1;
  ON_UUID local_18;
  
  local_18.Data4 = manifest_item_id.Data4;
  local_18._0_8_ = manifest_item_id._0_8_;
  this_00 = this->m_impl;
  if (this_00 != (ON_ComponentManifestImpl *)0x0) {
    pOVar1 = ON_ComponentManifestImpl::ItemFromManifestId(this_00,&local_18);
    pOVar1 = ON_ComponentManifestImpl::DeleteItem(this_00,pOVar1);
    if (pOVar1 != (ON_ComponentManifestItem_PRIVATE *)0x0) {
      return &pOVar1->super_ON_ComponentManifestItem;
    }
  }
  return &ON_ComponentManifestItem::UnsetItem;
}

Assistant:

const ON_ComponentManifestItem& ON_ComponentManifest::DeleteComponent(
  ON_UUID manifest_item_id
  )
{
  if (nullptr == m_impl)
    return ON_ComponentManifestItem::UnsetItem;

  const ON_ComponentManifestItem_PRIVATE* manifest_item = m_impl->DeleteItem(
    m_impl->ItemFromManifestId(manifest_item_id)
    );

  return (nullptr != manifest_item) ? *manifest_item : ON_ComponentManifestItem::UnsetItem;
}